

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

void __thiscall DFraggleThinker::Tick(DFraggleThinker *this)

{
  bool bVar1;
  DRunningScript *pDVar2;
  DFsScript *pDVar3;
  DFsVariable *pointed;
  DRunningScript *pDVar4;
  DFsScript *pDVar5;
  int local_24;
  DRunningScript *pDStack_20;
  int i;
  DRunningScript *next;
  DRunningScript *current;
  DFraggleThinker *this_local;
  
  pDVar2 = TObjPtr<DRunningScript>::operator->(&this->RunningScripts);
  next = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&pDVar2->next);
  while (next != (DRunningScript *)0x0) {
    bVar1 = wait_finished(this,next);
    if (bVar1) {
      for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
        pDVar3 = TObjPtr<DFsScript>::operator->(&next->script);
        pDVar3->variables[local_24].field_0 = next->variables[local_24].field_0;
        pDVar3 = ::TObjPtr::operator_cast_to_DFsScript_((TObjPtr *)&next->script);
        pointed = ::TObjPtr::operator_cast_to_DFsVariable_((TObjPtr *)(next->variables + local_24));
        GC::WriteBarrier(&pDVar3->super_DObject,&pointed->super_DObject);
        TObjPtr<DFsVariable>::operator=(next->variables + local_24,(DFsVariable *)0x0);
      }
      pDVar3 = TObjPtr<DFsScript>::operator->(&next->script);
      (pDVar3->trigger).field_0 = (next->trigger).field_0;
      pDVar2 = TObjPtr<DRunningScript>::operator->(&next->prev);
      (pDVar2->next).field_0 = (next->next).field_0;
      pDVar2 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&next->prev);
      pDVar4 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&next->next);
      GC::WriteBarrier(&pDVar2->super_DObject,&pDVar4->super_DObject);
      pDVar2 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&next->next);
      if (pDVar2 != (DRunningScript *)0x0) {
        pDVar2 = TObjPtr<DRunningScript>::operator->(&next->next);
        (pDVar2->prev).field_0 = (next->prev).field_0;
        pDVar2 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&next->next);
        pDVar4 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&next->prev);
        GC::WriteBarrier(&pDVar2->super_DObject,&pDVar4->super_DObject);
      }
      pDStack_20 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&next->next);
      pDVar3 = TObjPtr<DFsScript>::operator->(&next->script);
      pDVar5 = TObjPtr<DFsScript>::operator->(&next->script);
      DFsScript::ParseScript(pDVar3,pDVar5->data + next->save_point);
      (*(next->super_DObject)._vptr_DObject[4])();
    }
    else {
      pDStack_20 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&next->next);
    }
    next = pDStack_20;
  }
  return;
}

Assistant:

void DFraggleThinker::Tick()
{
	DRunningScript *current, *next;
	int i;
	
	current = RunningScripts->next;
    
	while(current)
	{
		if(wait_finished(current))
		{
			// copy out the script variables from the
			// runningscript
			
			for(i=0; i<VARIABLESLOTS; i++)
			{
				current->script->variables[i] = current->variables[i];
				GC::WriteBarrier(current->script, current->variables[i]);
				current->variables[i] = NULL;
			}
			current->script->trigger = current->trigger; // copy trigger
			
			// unhook from chain 
			current->prev->next = current->next;
			GC::WriteBarrier(current->prev, current->next);
			if(current->next) 
			{
				current->next->prev = current->prev;
				GC::WriteBarrier(current->next, current->prev);
			}
			next = current->next;   // save before freeing
			
			// continue the script
			current->script->ParseScript (current->script->data + current->save_point);

			// free
			current->Destroy();
		}
		else
			next = current->next;
		current = next;   // continue to next in chain
	}
}